

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathObjectPtr xmlXPathConvertBoolean(xmlXPathObjectPtr val)

{
  int val_00;
  xmlXPathObjectPtr pxVar1;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    val = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
    if (val == (xmlXPathObjectPtr)0x0) {
      val = (xmlXPathObjectPtr)0x0;
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating boolean object\n");
    }
    else {
      *(undefined8 *)val = 0;
      val->nodesetval = (xmlNodeSetPtr)0x0;
      *(undefined8 *)&val->boolval = 0;
      val->floatval = 0.0;
      *(undefined8 *)&val->index = 0;
      val->user2 = (void *)0x0;
      val->stringval = (xmlChar *)0x0;
      val->user = (void *)0x0;
      *(undefined8 *)&val->index2 = 0;
      val->type = XPATH_BOOLEAN;
      val->boolval = 0;
    }
  }
  else if (val->type != XPATH_BOOLEAN) {
    val_00 = xmlXPathCastToBoolean(val);
    pxVar1 = xmlXPathNewBoolean(val_00);
    xmlXPathFreeObject(val);
    val = pxVar1;
  }
  return val;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertBoolean(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(xmlXPathNewBoolean(0));
    if (val->type == XPATH_BOOLEAN)
	return(val);
    ret = xmlXPathNewBoolean(xmlXPathCastToBoolean(val));
    xmlXPathFreeObject(val);
    return(ret);
}